

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseRequirement(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_00000068;
  undefined8 uVar4;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar3) {
    bVar5 = 0;
  }
  else {
    uVar1 = (local_10->parse_state).mangled_idx;
    uVar2 = (local_10->parse_state).out_cur_idx;
    uVar4 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
    if ((bVar3) && (bVar3 = ParseExpression(in_stack_00000068), bVar3)) {
      bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
      bVar3 = Optional(bVar3);
      if ((bVar3) &&
         ((bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38)), !bVar3
          || (bVar3 = ParseTypeConstraint((State *)0x3b7194), bVar3)))) {
        bVar5 = 1;
        goto LAB_003b72a3;
      }
    }
    (local_10->parse_state).mangled_idx = uVar1;
    (local_10->parse_state).out_cur_idx = uVar2;
    *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
    bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
    if ((bVar3) &&
       (bVar3 = ParseType((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
       bVar3)) {
      bVar5 = 1;
    }
    else {
      (local_10->parse_state).mangled_idx = uVar1;
      (local_10->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
      bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
      if ((bVar3) && (bVar3 = ParseExpression(in_stack_00000068), bVar3)) {
        bVar5 = 1;
      }
      else {
        (local_10->parse_state).mangled_idx = uVar1;
        (local_10->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
        bVar5 = 0;
      }
    }
  }
LAB_003b72a3:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(bVar5 & 1);
}

Assistant:

static bool ParseRequirement(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      Optional(ParseOneCharToken(state, 'N')) &&
      // This logic backtracks cleanly if we eat an R but a valid type doesn't
      // follow it.
      (!ParseOneCharToken(state, 'R') || ParseTypeConstraint(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'T') && ParseType(state)) return true;
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) return true;
  state->parse_state = copy;

  return false;
}